

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::AdaDelta::adaDeltaRule
          (AdaDelta *this,Array *var,Array *grad,float *squaredVarDelta,float *squaredGradAccum)

{
  float *pfVar1;
  float *y_begin;
  float *pfVar2;
  float *y_end;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pfVar1 = grad->_M_data;
  pfVar2 = pfVar1 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar2 = (float *)0x0;
    pfVar1 = (float *)0x0;
  }
  fVar3 = internal::dot<float_const*,float_const*>(pfVar1,pfVar2,pfVar1,pfVar2);
  fVar4 = this->momentum * *squaredGradAccum + (1.0 - this->momentum) * fVar3;
  *squaredGradAccum = fVar4;
  fVar4 = fVar4 + this->epsilon;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = *squaredVarDelta + this->epsilon;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = fVar5 / fVar4;
  *squaredVarDelta =
       this->momentum * *squaredVarDelta + fVar3 * (1.0 - this->momentum) * fVar5 * fVar5;
  pfVar1 = grad->_M_data;
  pfVar2 = pfVar1 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar2 = (float *)0x0;
    pfVar1 = (float *)0x0;
  }
  y_begin = var->_M_data;
  y_end = y_begin + var->_M_size;
  if (var->_M_size == 0) {
    y_end = (float *)0x0;
    y_begin = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-fVar5,pfVar1,pfVar2,y_begin,y_end);
  return;
}

Assistant:

void adaDeltaRule(Array &var, const Array &grad,
                     float &squaredVarDelta, float &squaredGradAccum) {
        auto g_begin = std::begin(grad);
        auto g_end = std::end(grad);
        // compute gradient norm
        float grad2 = internal::dot(g_begin, g_end, g_begin, g_end);
        // accumuate squared gradient (with exponential smoothing)
        squaredGradAccum = momentum*squaredGradAccum + (1-momentum)*grad2;
        // compute updates (time step)
        float grad_RMS = sqrt(squaredGradAccum + epsilon);
        float delta_RMS = sqrt(squaredVarDelta + epsilon);
        float eta = delta_RMS / grad_RMS;
        // accumuate squared updates (with exponential smoothing)
        squaredVarDelta = momentum*squaredVarDelta + (1-momentum)*grad2*eta*eta;
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-eta,                      // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
    }